

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmSat.c
# Opt level: O0

int Sfm_NtkWindowToSolver(Sfm_Ntk_t *p)

{
  sat_solver *psVar1;
  Vec_Wec_t *pVVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  abctime aVar6;
  Vec_Int_t *vCnf;
  Vec_Int_t *pVVar7;
  int *piVar8;
  int *piVar9;
  abctime aVar10;
  abctime clk;
  int local_30;
  int k;
  int i;
  int iFanin;
  int iNode;
  int RetValue;
  Vec_Int_t *vClause;
  Sfm_Ntk_t *p_local;
  
  aVar6 = Abc_Clock();
  sat_solver_restart(p->pSat);
  psVar1 = p->pSat;
  iVar3 = Vec_IntSize(p->vOrder);
  iVar4 = Vec_IntSize(p->vTfo);
  iVar5 = Vec_IntSize(p->vRoots);
  sat_solver_setnvars(psVar1,iVar3 + iVar4 + iVar5 + 0xb);
  Sfm_NtkCleanVars(p);
  p->nSatVars = 1;
  for (local_30 = 0; iVar3 = Vec_IntSize(p->vOrder), local_30 < iVar3; local_30 = local_30 + 1) {
    iVar4 = Vec_IntEntry(p->vOrder,local_30);
    iVar3 = p->nSatVars;
    p->nSatVars = iVar3 + 1;
    Sfm_ObjSetSatVar(p,iVar4,iVar3);
  }
  Vec_IntClear(p->vDivVars);
  for (local_30 = 0; iVar3 = Vec_IntSize(p->vDivs), local_30 < iVar3; local_30 = local_30 + 1) {
    iVar3 = Vec_IntEntry(p->vDivs,local_30);
    pVVar7 = p->vDivVars;
    iVar3 = Sfm_ObjSatVar(p,iVar3);
    Vec_IntPush(pVVar7,iVar3);
  }
  for (local_30 = 0; iVar3 = Vec_IntSize(p->vOrder), local_30 < iVar3; local_30 = local_30 + 1) {
    iVar3 = Vec_IntEntry(p->vOrder,local_30);
    iVar4 = Sfm_ObjIsPi(p,iVar3);
    if (iVar4 == 0) {
      Vec_IntClear(p->vFaninMap);
      for (clk._4_4_ = 0; iVar4 = Sfm_ObjFaninNum(p,iVar3), clk._4_4_ < iVar4;
          clk._4_4_ = clk._4_4_ + 1) {
        iVar4 = Sfm_ObjFanin(p,iVar3,clk._4_4_);
        pVVar7 = p->vFaninMap;
        iVar4 = Sfm_ObjSatVar(p,iVar4);
        Vec_IntPush(pVVar7,iVar4);
      }
      pVVar7 = p->vFaninMap;
      iVar4 = Sfm_ObjSatVar(p,iVar3);
      Vec_IntPush(pVVar7,iVar4);
      pVVar2 = p->vClauses;
      pVVar7 = Vec_WecEntry(p->vCnfs,iVar3);
      Sfm_TranslateCnf(pVVar2,(Vec_Str_t *)pVVar7,p->vFaninMap,-1);
      for (clk._4_4_ = 0; iVar3 = Vec_WecSize(p->vClauses), clk._4_4_ < iVar3;
          clk._4_4_ = clk._4_4_ + 1) {
        pVVar7 = Vec_WecEntry(p->vClauses,clk._4_4_);
        iVar3 = Vec_IntSize(pVVar7);
        if (iVar3 == 0) break;
        psVar1 = p->pSat;
        piVar8 = Vec_IntArray(pVVar7);
        piVar9 = Vec_IntArray(pVVar7);
        iVar3 = Vec_IntSize(pVVar7);
        iVar3 = sat_solver_addclause(psVar1,piVar8,piVar9 + iVar3);
        if (iVar3 == 0) {
          return 0;
        }
      }
    }
  }
  iVar3 = Vec_IntSize(p->vTfo);
  if (0 < iVar3) {
    if (p->pPars->nTfoLevMax < 1) {
      __assert_fail("p->pPars->nTfoLevMax > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmSat.c"
                    ,100,"int Sfm_NtkWindowToSolver(Sfm_Ntk_t *)");
    }
    iVar3 = Vec_IntSize(p->vRoots);
    if (iVar3 < 1) {
      __assert_fail("Vec_IntSize(p->vRoots) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmSat.c"
                    ,0x65,"int Sfm_NtkWindowToSolver(Sfm_Ntk_t *)");
    }
    iVar3 = Vec_IntEntry(p->vTfo,0);
    if (iVar3 == p->iPivotNode) {
      __assert_fail("Vec_IntEntry(p->vTfo, 0) != p->iPivotNode",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmSat.c"
                    ,0x66,"int Sfm_NtkWindowToSolver(Sfm_Ntk_t *)");
    }
    Vec_IntClear(p->vLits);
    for (local_30 = 0; iVar3 = Vec_IntSize(p->vRoots), local_30 < iVar3; local_30 = local_30 + 1) {
      iVar3 = Vec_IntEntry(p->vRoots,local_30);
      pVVar7 = p->vLits;
      iVar3 = Sfm_ObjSatVar(p,iVar3);
      Vec_IntPush(pVVar7,iVar3);
    }
    for (local_30 = 0; iVar3 = Vec_IntSize(p->vTfo), local_30 < iVar3; local_30 = local_30 + 1) {
      iVar4 = Vec_IntEntry(p->vTfo,local_30);
      iVar3 = Sfm_ObjSatVar(p,iVar4);
      Sfm_ObjCleanSatVar(p,iVar3);
      iVar3 = p->nSatVars;
      p->nSatVars = iVar3 + 1;
      Sfm_ObjSetSatVar(p,iVar4,iVar3);
    }
    for (local_30 = 0; iVar3 = Vec_IntSize(p->vTfo), local_30 < iVar3; local_30 = local_30 + 1) {
      iVar3 = Vec_IntEntry(p->vTfo,local_30);
      iVar4 = Sfm_ObjIsNode(p,iVar3);
      if (iVar4 == 0) {
        __assert_fail("Sfm_ObjIsNode(p, iNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmSat.c"
                      ,0x74,"int Sfm_NtkWindowToSolver(Sfm_Ntk_t *)");
      }
      Vec_IntClear(p->vFaninMap);
      for (clk._4_4_ = 0; iVar4 = Sfm_ObjFaninNum(p,iVar3), clk._4_4_ < iVar4;
          clk._4_4_ = clk._4_4_ + 1) {
        iVar4 = Sfm_ObjFanin(p,iVar3,clk._4_4_);
        pVVar7 = p->vFaninMap;
        iVar4 = Sfm_ObjSatVar(p,iVar4);
        Vec_IntPush(pVVar7,iVar4);
      }
      pVVar7 = p->vFaninMap;
      iVar4 = Sfm_ObjSatVar(p,iVar3);
      Vec_IntPush(pVVar7,iVar4);
      pVVar2 = p->vClauses;
      vCnf = Vec_WecEntry(p->vCnfs,iVar3);
      pVVar7 = p->vFaninMap;
      iVar3 = Sfm_ObjSatVar(p,p->iPivotNode);
      Sfm_TranslateCnf(pVVar2,(Vec_Str_t *)vCnf,pVVar7,iVar3);
      for (clk._4_4_ = 0; iVar3 = Vec_WecSize(p->vClauses), clk._4_4_ < iVar3;
          clk._4_4_ = clk._4_4_ + 1) {
        pVVar7 = Vec_WecEntry(p->vClauses,clk._4_4_);
        iVar3 = Vec_IntSize(pVVar7);
        if (iVar3 == 0) break;
        psVar1 = p->pSat;
        piVar8 = Vec_IntArray(pVVar7);
        piVar9 = Vec_IntArray(pVVar7);
        iVar3 = Vec_IntSize(pVVar7);
        iVar3 = sat_solver_addclause(psVar1,piVar8,piVar9 + iVar3);
        if (iVar3 == 0) {
          return 0;
        }
      }
    }
    for (local_30 = 0; iVar3 = Vec_IntSize(p->vRoots), local_30 < iVar3; local_30 = local_30 + 1) {
      iVar3 = Vec_IntEntry(p->vRoots,local_30);
      psVar1 = p->pSat;
      iVar4 = Vec_IntEntry(p->vLits,local_30);
      iVar5 = Sfm_ObjSatVar(p,iVar3);
      iVar3 = p->nSatVars;
      p->nSatVars = iVar3 + 1;
      sat_solver_add_xor(psVar1,iVar4,iVar5,iVar3,0);
      pVVar7 = p->vLits;
      iVar3 = Abc_Var2Lit(p->nSatVars + -1,0);
      Vec_IntWriteEntry(pVVar7,local_30,iVar3);
    }
    psVar1 = p->pSat;
    piVar8 = Vec_IntArray(p->vLits);
    piVar9 = Vec_IntArray(p->vLits);
    iVar3 = Vec_IntSize(p->vLits);
    iVar3 = sat_solver_addclause(psVar1,piVar8,piVar9 + iVar3);
    if (iVar3 == 0) {
      return 0;
    }
  }
  iVar3 = sat_solver_simplify(p->pSat);
  aVar10 = Abc_Clock();
  p->timeCnf = (aVar10 - aVar6) + p->timeCnf;
  return iVar3;
}

Assistant:

int Sfm_NtkWindowToSolver( Sfm_Ntk_t * p )
{
    // p->vOrder contains all variables in the window in a good order
    // p->vDivs is a subset of nodes in p->vOrder used as divisor candidates
    // p->vTfo contains TFO of the node (does not include node)
    // p->vRoots contains roots of the TFO of the node (may include node)
    Vec_Int_t * vClause;
    int RetValue, iNode = -1, iFanin, i, k;
    abctime clk = Abc_Clock();
//    if ( p->pSat )
//        printf( "%d  ", p->pSat->stats.learnts );
    sat_solver_restart( p->pSat );
    sat_solver_setnvars( p->pSat, 1 + Vec_IntSize(p->vOrder) + Vec_IntSize(p->vTfo) + Vec_IntSize(p->vRoots) + 10 );
    // create SAT variables
    Sfm_NtkCleanVars( p );
    p->nSatVars = 1;
    Vec_IntForEachEntry( p->vOrder, iNode, i )
        Sfm_ObjSetSatVar( p, iNode, p->nSatVars++ );
    // collect divisor variables
    Vec_IntClear( p->vDivVars );
    Vec_IntForEachEntry( p->vDivs, iNode, i )
        Vec_IntPush( p->vDivVars, Sfm_ObjSatVar(p, iNode) );
    // add CNF clauses for the TFI
    Vec_IntForEachEntry( p->vOrder, iNode, i )
    {
        if ( Sfm_ObjIsPi(p, iNode) )
            continue;
        // collect fanin variables
        Vec_IntClear( p->vFaninMap );
        Sfm_ObjForEachFanin( p, iNode, iFanin, k )
            Vec_IntPush( p->vFaninMap, Sfm_ObjSatVar(p, iFanin) );
        Vec_IntPush( p->vFaninMap, Sfm_ObjSatVar(p, iNode) );
        // generate CNF 
        Sfm_TranslateCnf( p->vClauses, (Vec_Str_t *)Vec_WecEntry(p->vCnfs, iNode), p->vFaninMap, -1 );
        // add clauses
        Vec_WecForEachLevel( p->vClauses, vClause, k )
        {
            if ( Vec_IntSize(vClause) == 0 )
                break;
            RetValue = sat_solver_addclause( p->pSat, Vec_IntArray(vClause), Vec_IntArray(vClause) + Vec_IntSize(vClause) );
            if ( RetValue == 0 )
                return 0;
        }
    }
    if ( Vec_IntSize(p->vTfo) > 0 )
    {
        assert( p->pPars->nTfoLevMax > 0 );
        assert( Vec_IntSize(p->vRoots) > 0 );
        assert( Vec_IntEntry(p->vTfo, 0) != p->iPivotNode );
        // collect variables of root nodes
        Vec_IntClear( p->vLits );
        Vec_IntForEachEntry( p->vRoots, iNode, i )
            Vec_IntPush( p->vLits, Sfm_ObjSatVar(p, iNode) );
        // assign new variables to the TFO nodes
        Vec_IntForEachEntry( p->vTfo, iNode, i )
        {
            Sfm_ObjCleanSatVar( p, Sfm_ObjSatVar(p, iNode) );
            Sfm_ObjSetSatVar( p, iNode, p->nSatVars++ );
        }
        // add CNF clauses for the TFO
        Vec_IntForEachEntry( p->vTfo, iNode, i )
        {
            assert( Sfm_ObjIsNode(p, iNode) );
            // collect fanin variables
            Vec_IntClear( p->vFaninMap );
            Sfm_ObjForEachFanin( p, iNode, iFanin, k )
                Vec_IntPush( p->vFaninMap, Sfm_ObjSatVar(p, iFanin) );
            Vec_IntPush( p->vFaninMap, Sfm_ObjSatVar(p, iNode) );
            // generate CNF 
            Sfm_TranslateCnf( p->vClauses, (Vec_Str_t *)Vec_WecEntry(p->vCnfs, iNode), p->vFaninMap, Sfm_ObjSatVar(p, p->iPivotNode) );
            // add clauses
            Vec_WecForEachLevel( p->vClauses, vClause, k )
            {
                if ( Vec_IntSize(vClause) == 0 )
                    break;
                RetValue = sat_solver_addclause( p->pSat, Vec_IntArray(vClause), Vec_IntArray(vClause) + Vec_IntSize(vClause) );
                if ( RetValue == 0 )
                    return 0;
            }
        }
        // create XOR clauses for the roots
        Vec_IntForEachEntry( p->vRoots, iNode, i )
        {
            sat_solver_add_xor( p->pSat, Vec_IntEntry(p->vLits, i), Sfm_ObjSatVar(p, iNode), p->nSatVars++, 0 );
            Vec_IntWriteEntry( p->vLits, i, Abc_Var2Lit(p->nSatVars-1, 0) );
        }
        // make OR clause for the last nRoots variables
        RetValue = sat_solver_addclause( p->pSat, Vec_IntArray(p->vLits), Vec_IntArray(p->vLits) + Vec_IntSize(p->vLits) );
        if ( RetValue == 0 )
            return 0;
    }
    // finalize
    RetValue = sat_solver_simplify( p->pSat );
    p->timeCnf += Abc_Clock() - clk;
    return RetValue;
}